

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode Curl_sasl_start(SASL *sasl,Curl_easy *data,_Bool force_ir,saslprogress *progress)

{
  connectdata *pcVar1;
  _Bool _Var2;
  ushort uVar3;
  uchar *puVar4;
  size_t sVar5;
  size_t sVar6;
  saslstate local_cc;
  char *local_b0;
  undefined1 local_a8 [8];
  bufref nullmsg;
  char *oauth_bearer;
  char *service;
  int port;
  char *disp_hostname;
  char *hostname;
  saslstate state2;
  saslstate state1;
  bufref resp;
  char *mech;
  unsigned_short enabledmechs;
  connectdata *conn;
  CURLcode result;
  saslprogress *progress_local;
  _Bool force_ir_local;
  Curl_easy *data_local;
  SASL *sasl_local;
  
  conn._4_4_ = CURLE_OK;
  pcVar1 = data->conn;
  resp.len = 0;
  hostname._4_4_ = SASL_STOP;
  hostname._0_4_ = SASL_FINAL;
  if ((data->set).str[0xc] == (char *)0x0) {
    local_b0 = sasl->params->service;
  }
  else {
    local_b0 = (data->set).str[0xc];
  }
  nullmsg.len = (size_t)(data->set).str[0x3c];
  Curl_conn_get_host(data,0,&disp_hostname,(char **)&stack0xffffffffffffff88,
                     (int *)((long)&service + 4));
  Curl_bufref_init((bufref *)local_a8);
  Curl_bufref_init((bufref *)&state2);
  sasl->field_0x1e = sasl->field_0x1e & 0xfb | force_ir << 2;
  sasl->authused = 0;
  uVar3 = sasl->authmechs & sasl->prefmech;
  *progress = SASL_IDLE;
  if (((uVar3 & 0x20) == 0) || (*pcVar1->passwd != '\0')) {
    if ((data->state).aptr.user != (char *)0x0) {
      if (((uVar3 & 8) == 0) || (_Var2 = Curl_auth_is_digest_supported(), !_Var2)) {
        if ((uVar3 & 4) == 0) {
          if (((uVar3 & 0x40) == 0) || (_Var2 = Curl_auth_is_ntlm_supported(), !_Var2)) {
            if (((uVar3 & 0x100) == 0) || (nullmsg.len == 0)) {
              if (((uVar3 & 0x80) == 0) || (nullmsg.len == 0)) {
                if ((uVar3 & 2) == 0) {
                  if ((uVar3 & 1) != 0) {
                    resp.len = (long)"AUTH=+LOGIN" + 6;
                    hostname._4_4_ = SASL_LOGIN;
                    hostname._0_4_ = SASL_LOGIN_PASSWD;
                    sasl->authused = 1;
                    if ((force_ir) || ((*(ulong *)&(data->set).field_0x8ca >> 0x25 & 1) != 0)) {
                      Curl_auth_create_login_message(pcVar1->user,(bufref *)&state2);
                    }
                  }
                }
                else {
                  resp.len = (size_t)anon_var_dwarf_411c5;
                  hostname._4_4_ = SASL_PLAIN;
                  sasl->authused = 2;
                  if ((force_ir) || ((*(ulong *)&(data->set).field_0x8ca >> 0x25 & 1) != 0)) {
                    conn._4_4_ = Curl_auth_create_plain_message
                                           (pcVar1->sasl_authzid,pcVar1->user,pcVar1->passwd,
                                            (bufref *)&state2);
                  }
                }
              }
              else {
                resp.len = (size_t)anon_var_dwarf_411ae;
                hostname._4_4_ = SASL_OAUTH2;
                sasl->authused = 0x80;
                if ((force_ir) || ((*(ulong *)&(data->set).field_0x8ca >> 0x25 & 1) != 0)) {
                  conn._4_4_ = Curl_auth_create_xoauth_bearer_message
                                         (pcVar1->user,(char *)nullmsg.len,(bufref *)&state2);
                }
              }
            }
            else {
              resp.len = (size_t)anon_var_dwarf_41197;
              hostname._4_4_ = SASL_OAUTH2;
              hostname._0_4_ = SASL_OAUTH2_RESP;
              sasl->authused = 0x100;
              if ((force_ir) || ((*(ulong *)&(data->set).field_0x8ca >> 0x25 & 1) != 0)) {
                conn._4_4_ = Curl_auth_create_oauth_bearer_message
                                       (pcVar1->user,disp_hostname,(long)service._4_4_,
                                        (char *)nullmsg.len,(bufref *)&state2);
              }
            }
          }
          else {
            resp.len = (long)"Forcing HTTP/1.1 for NTLM" + 0x15;
            hostname._4_4_ = SASL_NTLM;
            hostname._0_4_ = SASL_NTLM_TYPE2MSG;
            sasl->authused = 0x40;
            if ((force_ir) || ((*(ulong *)&(data->set).field_0x8ca >> 0x25 & 1) != 0)) {
              conn._4_4_ = Curl_auth_create_ntlm_type1_message
                                     (data,pcVar1->user,pcVar1->passwd,local_b0,disp_hostname,
                                      &pcVar1->ntlm,(bufref *)&state2);
            }
          }
        }
        else {
          resp.len = (size_t)anon_var_dwarf_41175;
          hostname._4_4_ = SASL_CRAMMD5;
          sasl->authused = 4;
        }
      }
      else {
        resp.len = (size_t)anon_var_dwarf_4115e;
        hostname._4_4_ = SASL_DIGESTMD5;
        sasl->authused = 8;
      }
    }
  }
  else {
    resp.len = (size_t)anon_var_dwarf_41147;
    hostname._4_4_ = SASL_EXTERNAL;
    sasl->authused = 0x20;
    if ((force_ir) || ((*(ulong *)&(data->set).field_0x8ca >> 0x25 & 1) != 0)) {
      Curl_auth_create_external_message(pcVar1->user,(bufref *)&state2);
    }
  }
  if ((conn._4_4_ == CURLE_OK) && (resp.len != 0)) {
    sasl->curmech = (char *)resp.len;
    puVar4 = Curl_bufref_ptr((bufref *)&state2);
    if (puVar4 != (uchar *)0x0) {
      conn._4_4_ = build_message(sasl,(bufref *)&state2);
    }
    if (sasl->params->maxirlen != 0) {
      sVar5 = strlen((char *)resp.len);
      sVar6 = Curl_bufref_len((bufref *)&state2);
      if (sasl->params->maxirlen < sVar5 + sVar6) {
        Curl_bufref_free((bufref *)&state2);
      }
    }
    if (conn._4_4_ == CURLE_OK) {
      conn._4_4_ = (*sasl->params->sendauth)(data,(char *)resp.len,(bufref *)&state2);
    }
    if (conn._4_4_ == CURLE_OK) {
      *progress = SASL_INPROGRESS;
      puVar4 = Curl_bufref_ptr((bufref *)&state2);
      if (puVar4 == (uchar *)0x0) {
        local_cc = hostname._4_4_;
      }
      else {
        local_cc = (saslstate)hostname;
      }
      sasl_state(sasl,data,local_cc);
    }
  }
  Curl_bufref_free((bufref *)&state2);
  return conn._4_4_;
}

Assistant:

CURLcode Curl_sasl_start(struct SASL *sasl, struct Curl_easy *data,
                         bool force_ir, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  unsigned short enabledmechs;
  const char *mech = NULL;
  struct bufref resp;
  saslstate state1 = SASL_STOP;
  saslstate state2 = SASL_FINAL;
  const char *hostname, *disp_hostname;
  int port;
#if defined(USE_KERBEROS5) || defined(USE_NTLM)
  const char *service = data->set.str[STRING_SERVICE_NAME] ?
    data->set.str[STRING_SERVICE_NAME] :
    sasl->params->service;
#endif
  const char *oauth_bearer = data->set.str[STRING_BEARER];
  struct bufref nullmsg;

  Curl_conn_get_host(data, FIRSTSOCKET, &hostname, &disp_hostname, &port);
  Curl_bufref_init(&nullmsg);
  Curl_bufref_init(&resp);
  sasl->force_ir = force_ir;    /* Latch for future use */
  sasl->authused = 0;           /* No mechanism used yet */
  enabledmechs = sasl->authmechs & sasl->prefmech;
  *progress = SASL_IDLE;

  /* Calculate the supported authentication mechanism, by decreasing order of
     security, as well as the initial response where appropriate */
  if((enabledmechs & SASL_MECH_EXTERNAL) && !conn->passwd[0]) {
    mech = SASL_MECH_STRING_EXTERNAL;
    state1 = SASL_EXTERNAL;
    sasl->authused = SASL_MECH_EXTERNAL;

    if(force_ir || data->set.sasl_ir)
      Curl_auth_create_external_message(conn->user, &resp);
  }
  else if(data->state.aptr.user) {
#if defined(USE_KERBEROS5)
    if((enabledmechs & SASL_MECH_GSSAPI) && Curl_auth_is_gssapi_supported() &&
       Curl_auth_user_contains_domain(conn->user)) {
      sasl->mutual_auth = FALSE;
      mech = SASL_MECH_STRING_GSSAPI;
      state1 = SASL_GSSAPI;
      state2 = SASL_GSSAPI_TOKEN;
      sasl->authused = SASL_MECH_GSSAPI;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_gssapi_user_message(data, conn->user,
                                                      conn->passwd,
                                                      service,
                                                      conn->host.name,
                                                      sasl->mutual_auth,
                                                      NULL, &conn->krb5,
                                                      &resp);
    }
    else
#endif
#ifdef USE_GSASL
    if((enabledmechs & SASL_MECH_SCRAM_SHA_256) &&
       Curl_auth_gsasl_is_supported(data, SASL_MECH_STRING_SCRAM_SHA_256,
                                    &conn->gsasl)) {
      mech = SASL_MECH_STRING_SCRAM_SHA_256;
      sasl->authused = SASL_MECH_SCRAM_SHA_256;
      state1 = SASL_GSASL;
      state2 = SASL_GSASL;

      result = Curl_auth_gsasl_start(data, conn->user,
                                     conn->passwd, &conn->gsasl);
      if(result == CURLE_OK && (force_ir || data->set.sasl_ir))
        result = Curl_auth_gsasl_token(data, &nullmsg, &conn->gsasl, &resp);
    }
    else if((enabledmechs & SASL_MECH_SCRAM_SHA_1) &&
            Curl_auth_gsasl_is_supported(data, SASL_MECH_STRING_SCRAM_SHA_1,
                                         &conn->gsasl)) {
      mech = SASL_MECH_STRING_SCRAM_SHA_1;
      sasl->authused = SASL_MECH_SCRAM_SHA_1;
      state1 = SASL_GSASL;
      state2 = SASL_GSASL;

      result = Curl_auth_gsasl_start(data, conn->user,
                                     conn->passwd, &conn->gsasl);
      if(result == CURLE_OK && (force_ir || data->set.sasl_ir))
        result = Curl_auth_gsasl_token(data, &nullmsg, &conn->gsasl, &resp);
    }
    else
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
    if((enabledmechs & SASL_MECH_DIGEST_MD5) &&
       Curl_auth_is_digest_supported()) {
      mech = SASL_MECH_STRING_DIGEST_MD5;
      state1 = SASL_DIGESTMD5;
      sasl->authused = SASL_MECH_DIGEST_MD5;
    }
    else if(enabledmechs & SASL_MECH_CRAM_MD5) {
      mech = SASL_MECH_STRING_CRAM_MD5;
      state1 = SASL_CRAMMD5;
      sasl->authused = SASL_MECH_CRAM_MD5;
    }
    else
#endif
#ifdef USE_NTLM
    if((enabledmechs & SASL_MECH_NTLM) && Curl_auth_is_ntlm_supported()) {
      mech = SASL_MECH_STRING_NTLM;
      state1 = SASL_NTLM;
      state2 = SASL_NTLM_TYPE2MSG;
      sasl->authused = SASL_MECH_NTLM;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_ntlm_type1_message(data,
                                                     conn->user, conn->passwd,
                                                     service,
                                                     hostname,
                                                     &conn->ntlm, &resp);
      }
    else
#endif
    if((enabledmechs & SASL_MECH_OAUTHBEARER) && oauth_bearer) {
      mech = SASL_MECH_STRING_OAUTHBEARER;
      state1 = SASL_OAUTH2;
      state2 = SASL_OAUTH2_RESP;
      sasl->authused = SASL_MECH_OAUTHBEARER;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_oauth_bearer_message(conn->user,
                                                       hostname,
                                                       port,
                                                       oauth_bearer,
                                                       &resp);
    }
    else if((enabledmechs & SASL_MECH_XOAUTH2) && oauth_bearer) {
      mech = SASL_MECH_STRING_XOAUTH2;
      state1 = SASL_OAUTH2;
      sasl->authused = SASL_MECH_XOAUTH2;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_xoauth_bearer_message(conn->user,
                                                        oauth_bearer,
                                                        &resp);
    }
    else if(enabledmechs & SASL_MECH_PLAIN) {
      mech = SASL_MECH_STRING_PLAIN;
      state1 = SASL_PLAIN;
      sasl->authused = SASL_MECH_PLAIN;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_plain_message(conn->sasl_authzid,
                                                conn->user, conn->passwd,
                                                &resp);
    }
    else if(enabledmechs & SASL_MECH_LOGIN) {
      mech = SASL_MECH_STRING_LOGIN;
      state1 = SASL_LOGIN;
      state2 = SASL_LOGIN_PASSWD;
      sasl->authused = SASL_MECH_LOGIN;

      if(force_ir || data->set.sasl_ir)
        Curl_auth_create_login_message(conn->user, &resp);
    }
  }

  if(!result && mech) {
    sasl->curmech = mech;
    if(Curl_bufref_ptr(&resp))
      result = build_message(sasl, &resp);

    if(sasl->params->maxirlen &&
       strlen(mech) + Curl_bufref_len(&resp) > sasl->params->maxirlen)
      Curl_bufref_free(&resp);

    if(!result)
      result = sasl->params->sendauth(data, mech, &resp);

    if(!result) {
      *progress = SASL_INPROGRESS;
      sasl_state(sasl, data, Curl_bufref_ptr(&resp) ? state2 : state1);
    }
  }

  Curl_bufref_free(&resp);
  return result;
}